

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skins.cpp
# Opt level: O0

void __thiscall CSkins::SaveSkinfile(CSkins *this,char *pSaveSkinName)

{
  long lVar1;
  int iVar2;
  IStorage *pIVar3;
  undefined4 extraout_var;
  undefined8 in_RSI;
  CJsonWriter *in_RDI;
  long in_FS_OFFSET;
  int Val_1;
  int Val;
  int c;
  bool CustomColors;
  int PartIndex;
  IOHANDLE File;
  CJsonWriter Writer;
  char aBuf [512];
  char *pName;
  CJsonWriter *this_00;
  char *in_stack_fffffffffffffd78;
  CSkins *this_01;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  int local_268;
  int local_260;
  char local_208 [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str_format(local_208,0x200,"skins/%s.json",in_RSI);
  pIVar3 = CComponent::Storage((CComponent *)0x1bfe2a);
  pName = (char *)0x0;
  this_00 = (CJsonWriter *)0x0;
  iVar2 = (*(pIVar3->super_IInterface)._vptr_IInterface[4])(pIVar3,local_208,2,0,0);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    this_01 = (CSkins *)&stack0xfffffffffffffdc8;
    CJsonWriter::CJsonWriter
              ((CJsonWriter *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               (IOHANDLE)in_RDI);
    CJsonWriter::BeginObject(this_00);
    CJsonWriter::WriteAttribute(this_00,pName);
    CJsonWriter::BeginObject(this_00);
    for (local_260 = 0; local_260 < 6; local_260 = local_260 + 1) {
      if (*ms_apSkinVariables[local_260] != '\0') {
        CJsonWriter::WriteAttribute(this_00,pName);
        CJsonWriter::BeginObject(this_00);
        CJsonWriter::WriteAttribute(this_00,pName);
        CJsonWriter::WriteStrValue(this_00,pName);
        iVar2 = *ms_apUCCVariables[local_260];
        CJsonWriter::WriteAttribute(this_00,pName);
        CJsonWriter::WriteBoolValue(this_00,SUB81((ulong)pName >> 0x38,0));
        if (iVar2 != 0) {
          for (local_268 = 0; local_268 < 3; local_268 = local_268 + 1) {
            CJsonWriter::WriteAttribute(this_00,pName);
            CJsonWriter::WriteIntValue(in_RDI,(int)((ulong)this_01 >> 0x20));
          }
          if (local_260 == 1) {
            CJsonWriter::WriteAttribute(this_00,pName);
            CJsonWriter::WriteIntValue(in_RDI,(int)((ulong)this_01 >> 0x20));
          }
        }
        CJsonWriter::EndObject(this_00);
      }
    }
    CJsonWriter::EndObject(this_00);
    CJsonWriter::EndObject(this_00);
    AddSkin(this_01,in_stack_fffffffffffffd78);
    CJsonWriter::~CJsonWriter(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CSkins::SaveSkinfile(const char *pSaveSkinName)
{
	char aBuf[IO_MAX_PATH_LENGTH];
	str_format(aBuf, sizeof(aBuf), "skins/%s.json", pSaveSkinName);
	IOHANDLE File = Storage()->OpenFile(aBuf, IOFLAG_WRITE, IStorage::TYPE_SAVE);
	if(!File)
		return;

	CJsonWriter Writer(File);

	Writer.BeginObject();
	Writer.WriteAttribute("skin");
	Writer.BeginObject();
	for(int PartIndex = 0; PartIndex < NUM_SKINPARTS; PartIndex++)
	{
		if(!ms_apSkinVariables[PartIndex][0])
			continue;

		// part start
		Writer.WriteAttribute(ms_apSkinPartNames[PartIndex]);
		Writer.BeginObject();
		{
			Writer.WriteAttribute("filename");
			Writer.WriteStrValue(ms_apSkinVariables[PartIndex]);

			const bool CustomColors = *ms_apUCCVariables[PartIndex];
			Writer.WriteAttribute("custom_colors");
			Writer.WriteBoolValue(CustomColors);

			if(CustomColors)
			{
				for(int c = 0; c < NUM_COLOR_COMPONENTS-1; c++)
				{
					int Val = (*ms_apColorVariables[PartIndex] >> (2-c)*8) & 0xff;
					Writer.WriteAttribute(ms_apColorComponents[c]);
					Writer.WriteIntValue(Val);
				}
				if(PartIndex == SKINPART_MARKING)
				{
					int Val = (*ms_apColorVariables[PartIndex] >> 24) & 0xff;
					Writer.WriteAttribute(ms_apColorComponents[3]);
					Writer.WriteIntValue(Val);
				}
			}
		}
		Writer.EndObject();
	}
	Writer.EndObject();
	Writer.EndObject();

	// add new skin to the skin list
	AddSkin(pSaveSkinName);
}